

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall HFactor::update(HFactor *this,HVector *aq,HVector *ep,HighsInt *iRow,HighsInt *hint)

{
  long in_RSI;
  RefactorInfo *in_RDI;
  HighsInt *in_stack_00000008;
  HighsInt in_stack_0000003c;
  HVector *in_stack_00000040;
  HVector *in_stack_00000048;
  HFactor *in_stack_00000050;
  HighsInt in_stack_0000005c;
  HVector *in_stack_00000060;
  HVector *in_stack_00000068;
  HFactor *in_stack_00000070;
  HighsInt in_stack_0000014c;
  HVector *in_stack_00000150;
  HVector *in_stack_00000158;
  HFactor *in_stack_00000160;
  HighsInt *in_stack_00000358;
  HVector *in_stack_00000360;
  HVector *in_stack_00000368;
  HFactor *in_stack_00000370;
  
  RefactorInfo::clear(in_RDI);
  if (*(long *)(in_RSI + 0x70) == 0) {
    if (*(int *)&in_RDI[4].pivot_type.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                 _M_impl.super__Vector_impl_data._M_start == 1) {
      updateFT(in_stack_00000160,in_stack_00000158,in_stack_00000150,in_stack_0000014c);
    }
    if (*(int *)&in_RDI[4].pivot_type.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                 _M_impl.super__Vector_impl_data._M_start == 2) {
      updatePF((HFactor *)ep,(HVector *)iRow,hint._4_4_,in_stack_00000008);
    }
    if (*(int *)&in_RDI[4].pivot_type.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                 _M_impl.super__Vector_impl_data._M_start == 3) {
      updateMPF(in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_0000005c,
                (HighsInt *)in_stack_00000050);
    }
    if (*(int *)&in_RDI[4].pivot_type.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                 _M_impl.super__Vector_impl_data._M_start == 4) {
      updateAPF(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003c);
    }
  }
  else {
    updateCFT(in_stack_00000370,in_stack_00000368,in_stack_00000360,in_stack_00000358);
  }
  return;
}

Assistant:

void HFactor::update(HVector* aq, HVector* ep, HighsInt* iRow, HighsInt* hint) {
  // Updating implies a change of basis. Since the refactorizaion info
  // no longer corresponds to the current basis, it must be
  // invalidated
  this->refactor_info_.clear();
  // Special case
  if (aq->next) {
    updateCFT(aq, ep, iRow);
    return;
  }

  if (update_method == kUpdateMethodFt) updateFT(aq, ep, *iRow);
  if (update_method == kUpdateMethodPf) updatePF(aq, *iRow, hint);
  if (update_method == kUpdateMethodMpf) updateMPF(aq, ep, *iRow, hint);
  if (update_method == kUpdateMethodApf) updateAPF(aq, ep, *iRow);
}